

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O0

ngx_int_t ngx_http_variable_request_time
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  u_char *buf;
  u_char *puVar1;
  long local_48;
  ngx_msec_int_t ms;
  ngx_time_t *tp;
  u_char *p;
  uintptr_t data_local;
  ngx_http_variable_value_t *v_local;
  ngx_http_request_t *r_local;
  
  buf = (u_char *)ngx_pnalloc(r->pool,0x18);
  if (buf == (u_char *)0x0) {
    r_local = (ngx_http_request_t *)0xffffffffffffffff;
  }
  else {
    local_48 = (ngx_cached_time->sec - r->start_sec) * 1000 +
               (ngx_cached_time->msec - r->start_msec);
    if (local_48 < 0) {
      local_48 = 0;
    }
    puVar1 = ngx_sprintf(buf,"%T.%03M",local_48 / 1000,local_48 % 1000);
    *(uint *)v = *(uint *)v & 0xf0000000 | (int)puVar1 - (int)buf & 0xfffffffU;
    *(uint *)v = *(uint *)v & 0xefffffff | 0x10000000;
    *(uint *)v = *(uint *)v & 0xdfffffff;
    *(uint *)v = *(uint *)v & 0xbfffffff;
    v->data = buf;
    r_local = (ngx_http_request_t *)0x0;
  }
  return (ngx_int_t)r_local;
}

Assistant:

static ngx_int_t
ngx_http_variable_request_time(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    u_char          *p;
    ngx_time_t      *tp;
    ngx_msec_int_t   ms;

    p = ngx_pnalloc(r->pool, NGX_TIME_T_LEN + 4);
    if (p == NULL) {
        return NGX_ERROR;
    }

    tp = ngx_timeofday();

    ms = (ngx_msec_int_t)
             ((tp->sec - r->start_sec) * 1000 + (tp->msec - r->start_msec));
    ms = ngx_max(ms, 0);

    v->len = ngx_sprintf(p, "%T.%03M", (time_t) ms / 1000, ms % 1000) - p;
    v->valid = 1;
    v->no_cacheable = 0;
    v->not_found = 0;
    v->data = p;

    return NGX_OK;
}